

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
           *this)

{
  bool bVar1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  *this_00;
  size_t hashval_00;
  size_t sVar2;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  *in_RDI;
  FindInfo FVar3;
  anon_class_16_2_f7bee600 probe_index;
  size_t new_i;
  FindInfo target;
  size_t hashval;
  size_t i;
  slot_type *slot;
  type raw;
  method_base **in_stack_ffffffffffffff78;
  allocator<cs::method_base_*> *in_stack_ffffffffffffff80;
  allocator<cs::method_base_*> *in_stack_ffffffffffffff88;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  allocator<cs::method_base_*> *local_40;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  *local_20;
  
  bVar1 = IsValidCapacity(in_RDI->capacity_);
  if (!bVar1) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
                 );
  }
  bVar1 = is_small(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ConvertDeletedToEmptyAndFullToDeleted
              ((ctrl_t *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    local_20 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                *)0x0;
    do {
      if (local_20 ==
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
           *)in_RDI->capacity_) {
        reset_growth_left(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
        return;
      }
      bVar1 = IsDeleted(*(ctrl_t *)((long)&local_20->ctrl_ + (long)in_RDI->ctrl_));
      if (bVar1) {
        this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                   *)hash_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                               *)0x54b4b0);
        hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::method_base*>,void>::
        element<phmap::priv::FlatHashSetPolicy<cs::method_base*>>((slot_type *)0x54b4d2);
        hashval_00 = hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::method_base*>,void>::
                     apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base*>,phmap::priv::HashEq<cs::method_base*,void>::Hash,phmap::priv::HashEq<cs::method_base*,void>::Eq,std::allocator<cs::method_base*>>::HashElement,cs::method_base*&,phmap::priv::FlatHashSetPolicy<cs::method_base*>>
                               ((HashElement *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        FVar3 = find_first_non_full(this_00,local_40._8_8_);
        local_40 = (allocator<cs::method_base_*> *)FVar3.offset;
        in_stack_ffffffffffffff98 =
             drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                       ((anon_class_16_2_f7bee600 *)in_RDI,in_stack_ffffffffffffff98);
        sVar2 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                          ((anon_class_16_2_f7bee600 *)in_RDI,in_stack_ffffffffffffff98);
        _local_40 = FVar3;
        if (in_stack_ffffffffffffff98 == sVar2) {
          in_stack_ffffffffffffff90 = local_20;
          H2(hashval_00);
          set_ctrl(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                   (ctrl_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
        }
        else {
          bVar1 = IsEmpty((ctrl_t)local_40[(long)in_RDI->ctrl_]);
          if (bVar1) {
            H2(hashval_00);
            set_ctrl(in_stack_ffffffffffffff90,(size_t)local_40,
                     (ctrl_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
            alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                       *)0x54b5d0);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::method_base*>,void>::
            transfer<std::allocator<cs::method_base*>>
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(slot_type *)0x54b5fd);
            set_ctrl(in_stack_ffffffffffffff90,(size_t)local_40,
                     (ctrl_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
            in_stack_ffffffffffffff88 = local_40;
          }
          else {
            bVar1 = IsDeleted((ctrl_t)local_40[(long)in_RDI->ctrl_]);
            if (!bVar1) {
              __assert_fail("IsDeleted(ctrl_[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                            ,0x92b,
                            "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
                           );
            }
            H2(hashval_00);
            set_ctrl(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                     (ctrl_t)((ulong)local_40 >> 0x38));
            alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                       *)0x54b683);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::method_base*>,void>::
            transfer<std::allocator<cs::method_base*>>
                      (local_40,in_stack_ffffffffffffff78,(slot_type *)0x54b6a5);
            alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                       *)0x54b6af);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::method_base*>,void>::
            transfer<std::allocator<cs::method_base*>>
                      (local_40,in_stack_ffffffffffffff78,(slot_type *)0x54b6dc);
            alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                       *)0x54b6e6);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::method_base*>,void>::
            transfer<std::allocator<cs::method_base*>>
                      (local_40,in_stack_ffffffffffffff78,(slot_type *)0x54b708);
            local_20 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                        *)((long)&local_20[-1].settings_.
                                  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                                  .
                                  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>,_0UL,_false>
                                  .value + 7);
            in_stack_ffffffffffffff80 = local_40;
          }
        }
      }
      local_20 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                  *)((long)&local_20->ctrl_ + 1);
    } while( true );
  }
  __assert_fail("!is_small()",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8f9,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
               );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}